

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkValidate.cpp
# Opt level: O1

void __thiscall
glslang::TIntermediate::optimizeStageIO(TIntermediate *this,TInfoSink *param_1,TIntermediate *unit)

{
  TDestinationStack *pTVar1;
  char *__s;
  _List_node_base *p_Var2;
  long *plVar3;
  TIntermNode *pTVar4;
  undefined8 *******pppppppuVar5;
  _List_node_base *p_Var6;
  undefined8 *******pppppppuVar7;
  TIntermNode **ppTVar8;
  bool bVar9;
  int iVar10;
  long *plVar11;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *pbVar12;
  TQualifier *pTVar13;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *__str;
  undefined4 extraout_var_00;
  __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
  _Var14;
  __normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
  _Var15;
  anon_class_8_1_65350a3f demoteMatchingInputs;
  TIntermNode **ppTVar16;
  long lVar17;
  undefined8 *puVar18;
  TIntermSequence unitAllInputs;
  TIntermSequence unitLiveInputs;
  TIOTraverser unitTraverser;
  TIOTraverser unitAllTraverser;
  TIOTraverser allTraverser;
  TIntermSequence allOutputs;
  long *local_350;
  TIntermediate *local_348;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  *local_340;
  TPoolAllocator *local_338;
  TIntermNode **ppTStack_330;
  TIntermNode **local_328;
  undefined8 uStack_320;
  TPoolAllocator *local_318;
  TIntermNode **ppTStack_310;
  TIntermNode **local_308;
  undefined8 uStack_300;
  TLiveTraverser local_2f8;
  TPoolAllocator **local_228;
  undefined4 local_220;
  pool_allocator<char> local_218;
  undefined1 local_210;
  undefined7 local_20f;
  undefined4 uStack_208;
  TPoolAllocator *local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 ******local_1e0;
  undefined8 ******local_1d8;
  undefined8 local_1d0;
  TIntermediate *local_1c8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_1c0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_188;
  undefined1 local_150;
  TPoolAllocator **local_148;
  undefined4 local_140;
  TString local_138;
  undefined8 local_110;
  undefined8 uStack_108;
  undefined8 ******local_100;
  undefined8 ******local_f8;
  undefined8 local_f0;
  TIntermediate *local_e8;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_e0;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_a8;
  undefined1 local_70;
  TPoolAllocator **local_68;
  undefined4 local_60;
  TPoolAllocator *local_58;
  undefined8 *puStack_50;
  undefined8 *local_48;
  undefined8 uStack_40;
  
  if (((int)this->language < 5) && ((int)unit->language < 5)) {
    local_308 = (TIntermNode **)0x0;
    uStack_300 = 0;
    local_318 = (TPoolAllocator *)0x0;
    ppTStack_310 = (TIntermNode **)0x0;
    local_348 = this;
    local_318 = GetThreadPoolAllocator();
    ppTStack_310 = (TIntermNode **)0x0;
    local_308 = (TIntermNode **)0x0;
    uStack_300 = 0;
    pTVar1 = &local_2f8.destinations;
    local_2f8.super_TIntermTraverser._vptr_TIntermTraverser =
         (_func_int **)&PTR__TIntermTraverser_0093ba08;
    local_2f8.super_TIntermTraverser.preVisit = true;
    local_2f8.super_TIntermTraverser.path.
    super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
    super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
    super__Tp_alloc_type.allocator = (TPoolAllocator *)0x0;
    local_2f8.super_TIntermTraverser.path.
    super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
    super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_2f8.super_TIntermTraverser.path.
    super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
    super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2f8.super_TIntermTraverser.path.
    super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
    super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2f8.super_TIntermTraverser.inVisit = false;
    local_2f8.super_TIntermTraverser.postVisit = false;
    local_2f8.super_TIntermTraverser.rightToLeft = false;
    local_2f8.super_TIntermTraverser.depth = 0;
    local_2f8.super_TIntermTraverser.maxDepth = 0;
    local_2f8.super_TIntermTraverser.path.
    super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
    super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
    super__Tp_alloc_type.allocator = GetThreadPoolAllocator();
    local_2f8.super_TIntermTraverser.path.
    super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
    super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_2f8.super_TIntermTraverser.path.
    super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
    super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2f8.super_TIntermTraverser.path.
    super_vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>.
    super__Vector_base<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2f8.destinations.
    super__List_base<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>.
    _M_impl._M_node._M_size = 0;
    local_2f8.liveFunctions._M_h._M_buckets = &local_2f8.liveFunctions._M_h._M_single_bucket;
    local_2f8.liveFunctions._M_h._M_bucket_count = 1;
    local_2f8.liveFunctions._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_2f8.liveFunctions._M_h._M_element_count = 0;
    local_2f8.liveFunctions._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    local_2f8.liveFunctions._M_h._M_rehash_policy._M_next_resize = 0;
    local_2f8.liveFunctions._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_2f8.liveGlobals._M_h._M_buckets = &local_2f8.liveGlobals._M_h._M_single_bucket;
    local_2f8.liveGlobals._M_h._M_bucket_count = 1;
    local_2f8.liveGlobals._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_2f8.liveGlobals._M_h._M_element_count = 0;
    local_2f8.liveGlobals._M_h._M_rehash_policy._M_max_load_factor = 1.0;
    local_2f8.liveGlobals._M_h._M_rehash_policy._M_next_resize = 0;
    local_2f8.liveGlobals._M_h._M_single_bucket = (__node_base_ptr)0x0;
    local_2f8.traverseAll = false;
    local_2f8.super_TIntermTraverser._vptr_TIntermTraverser =
         (_func_int **)&PTR__TLiveTraverser_0093ba70;
    local_220 = 3;
    __s = (unit->entryPointMangledName)._M_dataplus._M_p;
    local_2f8.destinations.
    super__List_base<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>.
    _M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)pTVar1;
    local_2f8.destinations.
    super__List_base<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>.
    _M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)pTVar1;
    local_2f8.intermediate = unit;
    local_228 = &local_318;
    local_218.allocator = GetThreadPoolAllocator();
    std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
    basic_string<glslang::std::allocator<char>>
              ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)&local_138
               ,__s,&local_218);
    TLiveTraverser::pushFunction(&local_2f8,&local_138);
    if (local_2f8.destinations.
        super__List_base<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>.
        _M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)pTVar1) {
      do {
        p_Var6 = local_2f8.destinations.
                 super__List_base<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>
                 ._M_impl._M_node.super__List_node_base._M_prev;
        p_Var2 = local_2f8.destinations.
                 super__List_base<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>
                 ._M_impl._M_node.super__List_node_base._M_prev[1]._M_next;
        local_2f8.destinations.
        super__List_base<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>.
        _M_impl._M_node._M_size =
             local_2f8.destinations.
             super__List_base<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>
             ._M_impl._M_node._M_size - 1;
        std::__detail::_List_node_base::_M_unhook();
        operator_delete(p_Var6,0x18);
        (*(code *)p_Var2->_M_next[1]._M_next)(p_Var2,&local_2f8);
      } while (local_2f8.destinations.
               super__List_base<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>
               ._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)pTVar1);
    }
    local_48 = (undefined8 *)0x0;
    uStack_40 = 0;
    local_58 = (TPoolAllocator *)0x0;
    puStack_50 = (undefined8 *)0x0;
    local_58 = GetThreadPoolAllocator();
    puStack_50 = (undefined8 *)0x0;
    local_48 = (undefined8 *)0x0;
    uStack_40 = 0;
    local_328 = (TIntermNode **)0x0;
    uStack_320 = 0;
    local_338 = (TPoolAllocator *)0x0;
    ppTStack_330 = (TIntermNode **)0x0;
    local_338 = GetThreadPoolAllocator();
    ppTStack_330 = (TIntermNode **)0x0;
    local_328 = (TIntermNode **)0x0;
    uStack_320 = 0;
    local_138._M_dataplus.super_allocator_type.allocator =
         (TPoolAllocator *)&PTR__TIntermTraverser_0093ba08;
    local_138._M_dataplus._M_p._0_1_ = 1;
    local_138.field_2._M_allocated_capacity = 0;
    local_138.field_2._8_8_ = 0;
    local_110 = 0;
    uStack_108 = 0;
    local_138._M_dataplus._M_p._1_7_ = 0;
    local_138._M_string_length._0_4_ = 0;
    local_138.field_2._M_allocated_capacity = (size_type)GetThreadPoolAllocator();
    local_138.field_2._8_8_ = 0;
    local_110 = 0;
    uStack_108 = 0;
    local_f0 = 0;
    local_e8 = local_348;
    local_e0._M_buckets = &local_e0._M_single_bucket;
    local_e0._M_bucket_count = 1;
    local_e0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_e0._M_element_count = 0;
    local_e0._M_rehash_policy._M_max_load_factor = 1.0;
    local_e0._M_rehash_policy._M_next_resize = 0;
    local_e0._M_single_bucket = (__node_base_ptr)0x0;
    local_a8._M_buckets = &local_a8._M_single_bucket;
    local_a8._M_bucket_count = 1;
    local_a8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_a8._M_element_count = 0;
    local_a8._M_rehash_policy._M_max_load_factor = 1.0;
    local_a8._M_rehash_policy._M_next_resize = 0;
    local_a8._M_single_bucket = (__node_base_ptr)0x0;
    local_70 = 1;
    local_138._M_dataplus.super_allocator_type.allocator =
         (TPoolAllocator *)&PTR__TLiveTraverser_0093ba70;
    local_60 = 4;
    local_100 = &local_100;
    local_f8 = &local_100;
    local_68 = &local_58;
    (*local_348->treeRoot->_vptr_TIntermNode[2])();
    local_218.allocator = (TPoolAllocator *)&PTR__TIntermTraverser_0093ba08;
    local_210 = 1;
    local_200 = (TPoolAllocator *)0x0;
    uStack_1f8 = 0;
    local_1f0 = 0;
    uStack_1e8 = 0;
    local_20f = 0;
    uStack_208 = 0;
    local_200 = GetThreadPoolAllocator();
    uStack_1f8 = 0;
    local_1f0 = 0;
    uStack_1e8 = 0;
    local_1d0 = 0;
    local_1c0._M_buckets = &local_1c0._M_single_bucket;
    local_1c0._M_bucket_count = 1;
    local_1c0._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_1c0._M_element_count = 0;
    local_1c0._M_rehash_policy._M_max_load_factor = 1.0;
    local_1c0._M_rehash_policy._M_next_resize = 0;
    local_1c0._M_single_bucket = (__node_base_ptr)0x0;
    local_340 = &local_188;
    local_188._M_buckets = &local_188._M_single_bucket;
    local_188._M_bucket_count = 1;
    local_188._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_188._M_element_count = 0;
    local_188._M_rehash_policy._M_max_load_factor = 1.0;
    local_188._M_rehash_policy._M_next_resize = 0;
    local_188._M_single_bucket = (__node_base_ptr)0x0;
    local_150 = 1;
    local_218.allocator = (TPoolAllocator *)&PTR__TLiveTraverser_0093ba70;
    local_148 = &local_338;
    local_140 = 3;
    local_1e0 = &local_1e0;
    local_1d8 = &local_1e0;
    local_1c8 = unit;
    (*unit->treeRoot->_vptr_TIntermNode[2])();
    local_348 = (TIntermediate *)local_48;
    puVar18 = puStack_50;
    if (puStack_50 != local_48) {
      do {
        plVar3 = (long *)*puVar18;
        plVar11 = (long *)(**(code **)(*plVar3 + 0x60))(plVar3);
        pbVar12 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                  (**(code **)(*plVar11 + 0x1a0))(plVar11);
        iVar10 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                           (pbVar12,0,3,"gl_");
        if (iVar10 != 0) {
          plVar11 = (long *)(**(code **)(*plVar3 + 0x60))(plVar3);
          iVar10 = (**(code **)(*plVar11 + 0x100))(plVar11);
          ppTVar8 = local_308;
          if (iVar10 != 0x10) {
            lVar17 = (long)local_308 - (long)ppTStack_310 >> 5;
            _Var14._M_current = ppTStack_310;
            local_350 = plVar3;
            if (0 < lVar17) {
              lVar17 = lVar17 + 1;
              do {
                bVar9 = __gnu_cxx::__ops::
                        _Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::$_0::operator()(TIntermNode*)const::{lambda(TIntermNode*)#1}>
                        ::operator()((_Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::__0::operator()(TIntermNode*)const::_lambda(TIntermNode*)_1_>
                                      *)&local_350,_Var14);
                _Var15._M_current = _Var14._M_current;
                if (bVar9) goto LAB_0036a992;
                bVar9 = __gnu_cxx::__ops::
                        _Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::$_0::operator()(TIntermNode*)const::{lambda(TIntermNode*)#1}>
                        ::operator()((_Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::__0::operator()(TIntermNode*)const::_lambda(TIntermNode*)_1_>
                                      *)&local_350,
                                     (__normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                                      )(_Var14._M_current + 1));
                _Var15._M_current = _Var14._M_current + 1;
                if (bVar9) goto LAB_0036a992;
                bVar9 = __gnu_cxx::__ops::
                        _Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::$_0::operator()(TIntermNode*)const::{lambda(TIntermNode*)#1}>
                        ::operator()((_Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::__0::operator()(TIntermNode*)const::_lambda(TIntermNode*)_1_>
                                      *)&local_350,
                                     (__normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                                      )(_Var14._M_current + 2));
                _Var15._M_current = _Var14._M_current + 2;
                if (bVar9) goto LAB_0036a992;
                bVar9 = __gnu_cxx::__ops::
                        _Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::$_0::operator()(TIntermNode*)const::{lambda(TIntermNode*)#1}>
                        ::operator()((_Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::__0::operator()(TIntermNode*)const::_lambda(TIntermNode*)_1_>
                                      *)&local_350,
                                     (__normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                                      )(_Var14._M_current + 3));
                _Var15._M_current = _Var14._M_current + 3;
                if (bVar9) goto LAB_0036a992;
                _Var14._M_current = _Var14._M_current + 4;
                lVar17 = lVar17 + -1;
              } while (1 < lVar17);
            }
            lVar17 = (long)ppTVar8 - (long)_Var14._M_current >> 3;
            if (lVar17 == 1) {
LAB_0036a97e:
              bVar9 = __gnu_cxx::__ops::
                      _Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::$_0::operator()(TIntermNode*)const::{lambda(TIntermNode*)#1}>
                      ::operator()((_Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::__0::operator()(TIntermNode*)const::_lambda(TIntermNode*)_1_>
                                    *)&local_350,_Var14);
              _Var15._M_current = _Var14._M_current;
              if (!bVar9) {
                _Var15._M_current = ppTVar8;
              }
            }
            else if (lVar17 == 2) {
LAB_0036a964:
              bVar9 = __gnu_cxx::__ops::
                      _Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::$_0::operator()(TIntermNode*)const::{lambda(TIntermNode*)#1}>
                      ::operator()((_Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::__0::operator()(TIntermNode*)const::_lambda(TIntermNode*)_1_>
                                    *)&local_350,_Var14);
              _Var15._M_current = _Var14._M_current;
              if (!bVar9) {
                _Var14._M_current = _Var14._M_current + 1;
                goto LAB_0036a97e;
              }
            }
            else {
              _Var15._M_current = ppTVar8;
              if ((lVar17 == 3) &&
                 (bVar9 = __gnu_cxx::__ops::
                          _Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::$_0::operator()(TIntermNode*)const::{lambda(TIntermNode*)#1}>
                          ::operator()((_Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::__0::operator()(TIntermNode*)const::_lambda(TIntermNode*)_1_>
                                        *)&local_350,_Var14), _Var15._M_current = _Var14._M_current,
                 !bVar9)) {
                _Var14._M_current = _Var14._M_current + 1;
                goto LAB_0036a964;
              }
            }
LAB_0036a992:
            ppTVar16 = local_328;
            if (_Var15._M_current == ppTVar8) {
              lVar17 = (long)local_328 - (long)ppTStack_330 >> 5;
              _Var14._M_current = ppTStack_330;
              local_350 = plVar3;
              if (0 < lVar17) {
                lVar17 = lVar17 + 1;
                do {
                  bVar9 = __gnu_cxx::__ops::
                          _Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::$_0::operator()(TIntermNode*)const::{lambda(TIntermNode*)#2}>
                          ::operator()((_Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::__0::operator()(TIntermNode*)const::_lambda(TIntermNode*)_2_>
                                        *)&local_350,_Var14);
                  _Var15._M_current = _Var14._M_current;
                  if (bVar9) goto LAB_0036aa94;
                  bVar9 = __gnu_cxx::__ops::
                          _Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::$_0::operator()(TIntermNode*)const::{lambda(TIntermNode*)#2}>
                          ::operator()((_Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::__0::operator()(TIntermNode*)const::_lambda(TIntermNode*)_2_>
                                        *)&local_350,
                                       (__normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                                        )(_Var14._M_current + 1));
                  _Var15._M_current = _Var14._M_current + 1;
                  if (bVar9) goto LAB_0036aa94;
                  bVar9 = __gnu_cxx::__ops::
                          _Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::$_0::operator()(TIntermNode*)const::{lambda(TIntermNode*)#2}>
                          ::operator()((_Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::__0::operator()(TIntermNode*)const::_lambda(TIntermNode*)_2_>
                                        *)&local_350,
                                       (__normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                                        )(_Var14._M_current + 2));
                  _Var15._M_current = _Var14._M_current + 2;
                  if (bVar9) goto LAB_0036aa94;
                  bVar9 = __gnu_cxx::__ops::
                          _Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::$_0::operator()(TIntermNode*)const::{lambda(TIntermNode*)#2}>
                          ::operator()((_Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::__0::operator()(TIntermNode*)const::_lambda(TIntermNode*)_2_>
                                        *)&local_350,
                                       (__normal_iterator<TIntermNode_**,_std::vector<TIntermNode_*,_glslang::pool_allocator<TIntermNode_*>_>_>
                                        )(_Var14._M_current + 3));
                  _Var15._M_current = _Var14._M_current + 3;
                  if (bVar9) goto LAB_0036aa94;
                  _Var14._M_current = _Var14._M_current + 4;
                  lVar17 = lVar17 + -1;
                } while (1 < lVar17);
              }
              lVar17 = (long)ppTVar16 - (long)_Var14._M_current >> 3;
              if (lVar17 == 1) {
LAB_0036aa80:
                bVar9 = __gnu_cxx::__ops::
                        _Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::$_0::operator()(TIntermNode*)const::{lambda(TIntermNode*)#2}>
                        ::operator()((_Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::__0::operator()(TIntermNode*)const::_lambda(TIntermNode*)_2_>
                                      *)&local_350,_Var14);
                _Var15._M_current = _Var14._M_current;
                if (!bVar9) {
                  _Var15._M_current = ppTVar16;
                }
              }
              else if (lVar17 == 2) {
LAB_0036aa66:
                bVar9 = __gnu_cxx::__ops::
                        _Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::$_0::operator()(TIntermNode*)const::{lambda(TIntermNode*)#2}>
                        ::operator()((_Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::__0::operator()(TIntermNode*)const::_lambda(TIntermNode*)_2_>
                                      *)&local_350,_Var14);
                _Var15._M_current = _Var14._M_current;
                if (!bVar9) {
                  _Var14._M_current = _Var14._M_current + 1;
                  goto LAB_0036aa80;
                }
              }
              else {
                _Var15._M_current = ppTVar16;
                if ((lVar17 == 3) &&
                   (bVar9 = __gnu_cxx::__ops::
                            _Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::$_0::operator()(TIntermNode*)const::{lambda(TIntermNode*)#2}>
                            ::operator()((_Iter_pred<glslang::TIntermediate::optimizeStageIO(TInfoSink&,glslang::TIntermediate&)::__0::operator()(TIntermNode*)const::_lambda(TIntermNode*)_2_>
                                          *)&local_350,_Var14),
                   _Var15._M_current = _Var14._M_current, !bVar9)) {
                  _Var14._M_current = _Var14._M_current + 1;
                  goto LAB_0036aa66;
                }
              }
LAB_0036aa94:
              if (_Var15._M_current == ppTVar16) {
                plVar11 = (long *)(**(code **)(*plVar3 + 0x60))(plVar3);
                lVar17 = (**(code **)(*plVar11 + 0x108))(plVar11);
                *(ulong *)(lVar17 + 8) = (*(ulong *)(lVar17 + 8) & 0xffffffffffffff80) + 1;
                lVar17 = (**(code **)(*plVar11 + 0x108))(plVar11);
                *(ulong *)(lVar17 + 8) = *(ulong *)(lVar17 + 8) & 0xffffc01f1fffffff;
                pTVar13 = (TQualifier *)(**(code **)(*plVar11 + 0x108))(plVar11);
                TQualifier::clearLayout(pTVar13);
                ppTVar8 = local_328;
                for (ppTVar16 = ppTStack_330; ppTVar16 != ppTVar8; ppTVar16 = ppTVar16 + 1) {
                  pTVar4 = *ppTVar16;
                  plVar11 = (long *)(**(code **)(*plVar3 + 0x60))(plVar3);
                  pbVar12 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)(**(code **)(*plVar11 + 0x1a0))(plVar11);
                  iVar10 = (*pTVar4->_vptr_TIntermNode[0xc])(pTVar4);
                  __str = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar10) + 0x1a0))
                                       ((long *)CONCAT44(extraout_var,iVar10));
                  iVar10 = std::__cxx11::
                           basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                           ::compare(pbVar12,__str);
                  if (iVar10 == 0) {
                    iVar10 = (*pTVar4->_vptr_TIntermNode[0xc])(pTVar4);
                    plVar11 = (long *)CONCAT44(extraout_var_00,iVar10);
                    lVar17 = (**(code **)(*plVar11 + 0x108))(plVar11);
                    *(ulong *)(lVar17 + 8) = (*(ulong *)(lVar17 + 8) & 0xffffffffffffff80) + 1;
                    lVar17 = (**(code **)(*plVar11 + 0x108))(plVar11);
                    *(ulong *)(lVar17 + 8) = *(ulong *)(lVar17 + 8) & 0xffffc01f1fffffff;
                    pTVar13 = (TQualifier *)(**(code **)(*plVar11 + 0x108))(plVar11);
                    TQualifier::clearLayout(pTVar13);
                  }
                }
              }
            }
          }
        }
        puVar18 = puVar18 + 1;
      } while ((TIntermediate *)puVar18 != local_348);
    }
    local_218.allocator = (TPoolAllocator *)&PTR__TLiveTraverser_0093bbc8;
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(local_340);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_1c0);
    pppppppuVar7 = (undefined8 *******)local_1e0;
    while (pppppppuVar7 != &local_1e0) {
      pppppppuVar5 = (undefined8 *******)*pppppppuVar7;
      operator_delete(pppppppuVar7,0x18);
      pppppppuVar7 = pppppppuVar5;
    }
    local_138._M_dataplus.super_allocator_type.allocator =
         (TPoolAllocator *)&PTR__TLiveTraverser_0093bbc8;
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_a8);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_e0);
    pppppppuVar7 = (undefined8 *******)local_100;
    while (pppppppuVar7 != &local_100) {
      pppppppuVar5 = (undefined8 *******)*pppppppuVar7;
      operator_delete(pppppppuVar7,0x18);
      pppppppuVar7 = pppppppuVar5;
    }
    local_2f8.super_TIntermTraverser._vptr_TIntermTraverser =
         (_func_int **)&PTR__TLiveTraverser_0093bbc8;
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_2f8.liveGlobals._M_h);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_2f8.liveFunctions._M_h);
    p_Var2 = local_2f8.destinations.
             super__List_base<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    while (p_Var2 != (_List_node_base *)&local_2f8.destinations) {
      p_Var6 = (((_List_base<glslang::TIntermAggregate_*,_std::allocator<glslang::TIntermAggregate_*>_>
                  *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
      operator_delete(p_Var2,0x18);
      p_Var2 = p_Var6;
    }
  }
  return;
}

Assistant:

void TIntermediate::optimizeStageIO(TInfoSink&, TIntermediate& unit)
{
    // don't do any input/output demotion on compute, raytracing, or task/mesh stages
    // TODO: support task/mesh
    if (getStage() > EShLangFragment || unit.getStage() > EShLangFragment) {
        return;
    }

    class TIOTraverser : public TLiveTraverser {
    public:
        TIOTraverser(TIntermediate& i, bool all, TIntermSequence& sequence, TStorageQualifier storage)
            : TLiveTraverser(i, all, true, false, false), sequence(sequence), storage(storage)
        {
        }

        virtual void visitSymbol(TIntermSymbol* symbol)
        {
            if (symbol->getQualifier().storage == storage) {
                sequence.push_back(symbol);
            }
        }

    private:
        TIntermSequence& sequence;
        TStorageQualifier storage;
    };

    // live symbols only
    TIntermSequence unitLiveInputs;

    TIOTraverser unitTraverser(unit, false, unitLiveInputs, EvqVaryingIn);
    unitTraverser.pushFunction(unit.getEntryPointMangledName().c_str());
    while (! unitTraverser.destinations.empty()) {
        TIntermNode* destination = unitTraverser.destinations.back();
        unitTraverser.destinations.pop_back();
        destination->traverse(&unitTraverser);
    }

    TIntermSequence allOutputs;
    TIntermSequence unitAllInputs;

    TIOTraverser allTraverser(*this, true, allOutputs, EvqVaryingOut);
    getTreeRoot()->traverse(&allTraverser);

    TIOTraverser unitAllTraverser(unit, true, unitAllInputs, EvqVaryingIn);
    unit.getTreeRoot()->traverse(&unitAllTraverser);

    // find outputs not consumed by the next stage
    std::for_each(allOutputs.begin(), allOutputs.end(), [&unitLiveInputs, &unitAllInputs](TIntermNode* output) {
        // don't do anything to builtins
        if (output->getAsSymbolNode()->getAccessName().compare(0, 3, "gl_") == 0)
            return;

        // don't demote block outputs (for now)
        if (output->getAsSymbolNode()->getBasicType() == EbtBlock)
            return;

        // check if the (loose) output has a matching loose input
        auto isMatchingInput = [output](TIntermNode* input) {
            return output->getAsSymbolNode()->getAccessName() == input->getAsSymbolNode()->getAccessName();
        };

        // check if the (loose) output has a matching block member input
        auto isMatchingInputBlockMember = [output](TIntermNode* input) {
            // ignore loose inputs
            if (input->getAsSymbolNode()->getBasicType() != EbtBlock)
                return false;

            // don't demote loose outputs with matching input block members
            auto isMatchingBlockMember = [output](TTypeLoc type) {
                return type.type->getFieldName() == output->getAsSymbolNode()->getName();
            };
            const TTypeList* members = input->getAsSymbolNode()->getType().getStruct();
            return std::any_of(members->begin(), members->end(), isMatchingBlockMember);
        };

        // determine if the input/output pair should be demoted
        // do the faster (and more likely) loose-loose check first
        if (std::none_of(unitLiveInputs.begin(), unitLiveInputs.end(), isMatchingInput) && 
            std::none_of(unitAllInputs.begin(), unitAllInputs.end(), isMatchingInputBlockMember)) {
            // demote any input matching the output
            auto demoteMatchingInputs = [output](TIntermNode* input) {
                if (output->getAsSymbolNode()->getAccessName() == input->getAsSymbolNode()->getAccessName()) {
                    // demote input to a plain variable
                    TIntermSymbol* symbol = input->getAsSymbolNode();
                    symbol->getQualifier().storage = EvqGlobal;
                    symbol->getQualifier().clearInterstage();
                    symbol->getQualifier().clearLayout();
                }
            };

            // demote all matching outputs to a plain variable
            TIntermSymbol* symbol = output->getAsSymbolNode();
            symbol->getQualifier().storage = EvqGlobal;
            symbol->getQualifier().clearInterstage();
            symbol->getQualifier().clearLayout();
            std::for_each(unitAllInputs.begin(), unitAllInputs.end(), demoteMatchingInputs);
        }
    });
}